

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O2

repcodes_t ZSTD_newRep(U32 *rep,U32 offBase,U32 ll0)

{
  undefined8 uVar1;
  uint uVar2;
  U32 *pUVar3;
  U32 UVar4;
  repcodes_t rVar5;
  undefined8 local_10;
  U32 local_8 [2];
  
  local_8[0] = rep[2];
  local_10 = *(undefined8 *)rep;
  uVar1 = local_10;
  if (offBase < 4) {
    if (offBase == 0) {
      local_10 = uVar1;
      __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2d5,"void ZSTD_updateRep(U32 *, const U32, const U32)");
    }
    uVar2 = (offBase + ll0) - 1;
    if (uVar2 == 3) {
      UVar4 = (int)local_10 - 1;
    }
    else {
      if (uVar2 == 0) goto LAB_001eb4e2;
      UVar4 = local_8[(ulong)uVar2 - 2];
    }
    pUVar3 = (U32 *)((long)&local_10 + 4);
    if (uVar2 == 1) {
      pUVar3 = local_8;
    }
    local_8[0] = *pUVar3;
  }
  else {
    local_10._4_4_ = (U32)((ulong)local_10 >> 0x20);
    UVar4 = offBase - 3;
    local_8[0] = local_10._4_4_;
  }
  local_10 = CONCAT44((int)local_10,UVar4);
  uVar1 = local_10;
LAB_001eb4e2:
  local_10 = uVar1;
  rVar5.rep[2] = local_8[0];
  rVar5.rep[0] = (int)local_10;
  rVar5.rep[1] = local_10._4_4_;
  return (repcodes_t)rVar5.rep;
}

Assistant:

MEM_STATIC repcodes_t
ZSTD_newRep(U32 const rep[ZSTD_REP_NUM], U32 const offBase, U32 const ll0)
{
    repcodes_t newReps;
    ZSTD_memcpy(&newReps, rep, sizeof(newReps));
    ZSTD_updateRep(newReps.rep, offBase, ll0);
    return newReps;
}